

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprinteg.h
# Opt level: O0

void __thiscall
TPZPrInteg<TPZPrInteg<TPZPrInteg<TPZInt1Point>_>_>::TPZPrInteg
          (TPZPrInteg<TPZPrInteg<TPZPrInteg<TPZInt1Point>_>_> *this,int order)

{
  TPZGaussRule *pTVar1;
  int in_ESI;
  undefined8 *in_RDI;
  int in_stack_00000018;
  int in_stack_0000001c;
  TPZIntRuleList *in_stack_00000020;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  TPZPrInteg<TPZPrInteg<TPZInt1Point>_>::TPZPrInteg
            ((TPZPrInteg<TPZPrInteg<TPZInt1Point>_> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffec);
  *in_RDI = &PTR__TPZPrInteg_023dcb00;
  if (in_ESI < 1) {
    *(undefined4 *)(in_RDI + 5) = 0;
    in_RDI[6] = 0;
  }
  else {
    pTVar1 = TPZIntRuleList::GetRule(in_stack_00000020,in_stack_0000001c,in_stack_00000018);
    in_RDI[6] = pTVar1;
    *(int *)(in_RDI + 5) = in_ESI;
  }
  return;
}

Assistant:

TPZPrInteg(int order) : TFather(order)
    {
		if(order>0)
		{
			fIntP   = TPZIntRuleList::gIntRuleList.GetRule(order);
			fOrdKsi = order;
		}
		else
		{
			fOrdKsi = 0;
			fIntP = 0;
		}
    }